

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O0

size_t __thiscall
RVO::RVOSimulator::addObstacle
          (RVOSimulator *this,vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *vertices)

{
  size_t sVar1;
  size_type sVar2;
  Obstacle *pOVar3;
  Obstacle *pOVar4;
  const_reference pvVar5;
  reference ppOVar6;
  const_reference pvVar7;
  const_reference c;
  float fVar8;
  undefined1 *local_d0;
  undefined1 *local_a8;
  undefined1 *local_90;
  Vector2 local_54;
  Vector2 local_4c;
  Obstacle *local_38;
  Obstacle *obstacle;
  size_t i;
  size_t obstacleNo;
  vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *vertices_local;
  RVOSimulator *this_local;
  
  obstacleNo = (size_t)vertices;
  vertices_local = (vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)this;
  sVar2 = std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::size(vertices);
  if (sVar2 < 2) {
    this_local = (RVOSimulator *)0xffffffffffffffff;
  }
  else {
    i = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::size(&this->obstacles_);
    for (obstacle = (Obstacle *)0x0; pOVar4 = obstacle,
        pOVar3 = (Obstacle *)
                 std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::size
                           ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)obstacleNo),
        pOVar4 < pOVar3; obstacle = (Obstacle *)&obstacle->field_0x1) {
      pOVar4 = (Obstacle *)operator_new(0x30);
      Obstacle::Obstacle(pOVar4);
      local_38 = pOVar4;
      pvVar5 = std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::operator[]
                         ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)obstacleNo,
                          (size_type)obstacle);
      fVar8 = pvVar5->y_;
      (local_38->point_).x_ = pvVar5->x_;
      (local_38->point_).y_ = fVar8;
      if (obstacle != (Obstacle *)0x0) {
        ppOVar6 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::back
                            (&this->obstacles_);
        local_38->prevObstacle_ = *ppOVar6;
        local_38->prevObstacle_->nextObstacle_ = local_38;
      }
      pOVar4 = obstacle;
      sVar2 = std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::size
                        ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)obstacleNo);
      if (pOVar4 == (Obstacle *)(sVar2 - 1)) {
        ppOVar6 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::operator[]
                            (&this->obstacles_,i);
        local_38->nextObstacle_ = *ppOVar6;
        local_38->nextObstacle_->prevObstacle_ = local_38;
      }
      sVar1 = obstacleNo;
      pOVar4 = obstacle;
      sVar2 = std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::size
                        ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)obstacleNo);
      if (pOVar4 == (Obstacle *)(sVar2 - 1)) {
        local_90 = (undefined1 *)0x0;
      }
      else {
        local_90 = &obstacle->field_0x1;
      }
      pvVar5 = std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::operator[]
                         ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)sVar1,
                          (size_type)local_90);
      pvVar7 = std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::operator[]
                         ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)obstacleNo,
                          (size_type)obstacle);
      local_54 = Vector2::operator-(pvVar5,pvVar7);
      local_4c = normalize(&local_54);
      local_38->unitDir_ = local_4c;
      sVar2 = std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::size
                        ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)obstacleNo);
      sVar1 = obstacleNo;
      if (sVar2 == 2) {
        local_38->isConvex_ = true;
      }
      else {
        pOVar4 = obstacle;
        if (obstacle == (Obstacle *)0x0) {
          pOVar4 = (Obstacle *)
                   std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::size
                             ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)obstacleNo);
        }
        local_a8 = (undefined1 *)((long)&pOVar4[-1].id_ + 7);
        pvVar5 = std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::operator[]
                           ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)sVar1,
                            (size_type)local_a8);
        pvVar7 = std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::operator[]
                           ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)obstacleNo,
                            (size_type)obstacle);
        sVar1 = obstacleNo;
        pOVar4 = obstacle;
        sVar2 = std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::size
                          ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)obstacleNo);
        if (pOVar4 == (Obstacle *)(sVar2 - 1)) {
          local_d0 = (undefined1 *)0x0;
        }
        else {
          local_d0 = &obstacle->field_0x1;
        }
        c = std::vector<RVO::Vector2,_std::allocator<RVO::Vector2>_>::operator[]
                      ((vector<RVO::Vector2,_std::allocator<RVO::Vector2>_> *)sVar1,
                       (size_type)local_d0);
        fVar8 = leftOf(pvVar5,pvVar7,c);
        local_38->isConvex_ = 0.0 <= fVar8;
      }
      sVar2 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::size
                        (&this->obstacles_);
      local_38->id_ = sVar2;
      std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::push_back
                (&this->obstacles_,&local_38);
    }
    this_local = (RVOSimulator *)i;
  }
  return (size_t)this_local;
}

Assistant:

size_t RVOSimulator::addObstacle(const std::vector<Vector2> &vertices)
	{
		if (vertices.size() < 2) {
			return RVO_ERROR;
		}

		const size_t obstacleNo = obstacles_.size();

		for (size_t i = 0; i < vertices.size(); ++i) {
			Obstacle *obstacle = new Obstacle();
			obstacle->point_ = vertices[i];

			if (i != 0) {
				obstacle->prevObstacle_ = obstacles_.back();
				obstacle->prevObstacle_->nextObstacle_ = obstacle;
			}

			if (i == vertices.size() - 1) {
				obstacle->nextObstacle_ = obstacles_[obstacleNo];
				obstacle->nextObstacle_->prevObstacle_ = obstacle;
			}

			obstacle->unitDir_ = normalize(vertices[(i == vertices.size() - 1 ? 0 : i + 1)] - vertices[i]);

			if (vertices.size() == 2) {
				obstacle->isConvex_ = true;
			}
			else {
				obstacle->isConvex_ = (leftOf(vertices[(i == 0 ? vertices.size() - 1 : i - 1)], vertices[i], vertices[(i == vertices.size() - 1 ? 0 : i + 1)]) >= 0.0f);
			}

			obstacle->id_ = obstacles_.size();

			obstacles_.push_back(obstacle);
		}

		return obstacleNo;
	}